

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O0

String * doctest::toString(Approx *in)

{
  String *in_RDI;
  double in_stack_ffffffffffffff68;
  String *in_00;
  String *in_stack_ffffffffffffff80;
  String *in_stack_ffffffffffffffb0;
  String *in_stack_ffffffffffffffb8;
  
  in_00 = in_RDI;
  String::String(in_stack_ffffffffffffff80,(char *)in_RDI);
  toString(in_stack_ffffffffffffff68);
  operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  String::String(in_stack_ffffffffffffff80,(char *)in_00);
  operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  String::~String(in_RDI);
  String::~String(in_RDI);
  String::~String(in_RDI);
  String::~String(in_RDI);
  return in_00;
}

Assistant:

String toString(const Approx& in) {
    return "Approx( " + doctest::toString(in.m_value) + " )";
}